

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockSymbols.cpp
# Opt level: O3

StatementBlockSymbol *
slang::ast::StatementBlockSymbol::fromSyntax(Scope *scope,ForLoopStatementSyntax *syntax)

{
  NamedLabelSyntax *pNVar1;
  Compilation *compilation;
  ForVariableDeclarationSyntax *syntax_00;
  SyntaxNode *syntax_01;
  SourceLocation SVar2;
  StatementBlockSymbol *pSVar3;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar4;
  VariableSymbol *lastVar;
  ulong uVar5;
  long lVar6;
  string_view sVar7;
  span<const_slang::ast::StatementBlockSymbol_*const,_18446744073709551615UL> sVar8;
  string_view name;
  Token token;
  _Optional_payload_base<slang::ast::VariableLifetime> in_stack_ffffffffffffffa0;
  Token local_48;
  
  SVar2 = parsing::Token::location(&syntax->forKeyword);
  pNVar1 = (syntax->super_StatementSyntax).label;
  if (pNVar1 == (NamedLabelSyntax *)0x0) {
    sVar7 = (string_view)(ZEXT816(0x4f3aa0) << 0x40);
  }
  else {
    local_48.kind = (pNVar1->name).kind;
    local_48._2_1_ = (pNVar1->name).field_0x2;
    local_48.numFlags.raw = (pNVar1->name).numFlags.raw;
    local_48.rawLen = (pNVar1->name).rawLen;
    local_48.info = (pNVar1->name).info;
    sVar7 = parsing::Token::valueText(&local_48);
    SVar2 = parsing::Token::location(&local_48);
  }
  name._M_str = (char *)SVar2;
  name._M_len = (size_t)sVar7._M_str;
  pSVar3 = createBlock((ast *)scope,(Scope *)syntax,(StatementSyntax *)sVar7._M_len,name,
                       (SourceLocation)0x0,Sequential,
                       (optional<slang::ast::VariableLifetime>)in_stack_ffffffffffffffa0);
  uVar5 = (syntax->initializers).elements._M_extent._M_extent_value + 1;
  if (1 < uVar5) {
    compilation = scope->compilation;
    uVar5 = uVar5 >> 1;
    lVar6 = 0;
    lastVar = (VariableSymbol *)0x0;
    do {
      ppSVar4 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           ((long)&(((syntax->initializers).elements._M_ptr)->
                                   super_ConstTokenOrSyntax).
                                   super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                           + lVar6));
      syntax_00 = (ForVariableDeclarationSyntax *)*ppSVar4;
      syntax_01 = (syntax_00->super_SyntaxNode).previewNode;
      if (syntax_01 != (SyntaxNode *)0x0) {
        Scope::addMembers(&pSVar3->super_Scope,syntax_01);
      }
      lastVar = VariableSymbol::fromSyntax(compilation,syntax_00,lastVar);
      Scope::insertMember(&pSVar3->super_Scope,(Symbol *)lastVar,(pSVar3->super_Scope).lastMember,
                          false,true);
      lVar6 = lVar6 + 0x30;
      uVar5 = uVar5 - 1;
    } while (uVar5 != 0);
  }
  sVar8 = Statement::createAndAddBlockItems(&pSVar3->super_Scope,(syntax->statement).ptr,false);
  pSVar3->blocks = sVar8;
  return pSVar3;
}

Assistant:

StatementBlockSymbol& StatementBlockSymbol::fromSyntax(const Scope& scope,
                                                       const ForLoopStatementSyntax& syntax) {
    auto [name, loc] = getLabel(syntax, syntax.forKeyword.location());
    auto result = createBlock(scope, syntax, name, loc);

    // If one entry is a variable declaration, they must all be.
    // We'll only enter this function if we have variable decls.
    auto& comp = scope.getCompilation();
    const VariableSymbol* lastVar = nullptr;
    for (auto init : syntax.initializers) {
        if (init->previewNode)
            result->addMembers(*init->previewNode);

        auto& var = VariableSymbol::fromSyntax(comp, init->as<ForVariableDeclarationSyntax>(),
                                               lastVar);

        lastVar = &var;
        result->addMember(var);
    }

    result->blocks = Statement::createAndAddBlockItems(*result, *syntax.statement,
                                                       /* labelHandled */ false);
    return *result;
}